

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_generic.c
# Opt level: O0

_Bool tirpc_control(u_int rq,void *in)

{
  void *in_local;
  u_int rq_local;
  
  switch(rq) {
  case 0:
    memcpy(in,&__ntirpc_pkg_params,0x40);
    break;
  case 1:
    memcpy(&__ntirpc_pkg_params,in,0x40);
    break;
  case 2:
    *(uint32_t *)in = __ntirpc_pkg_params.debug_flags;
    break;
  case 3:
    __ntirpc_pkg_params.debug_flags = *in;
    break;
  case 4:
    *(uint32_t *)in = __ntirpc_pkg_params.other_flags;
    break;
  case 5:
    __ntirpc_pkg_params.other_flags = *in;
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool
tirpc_control(const u_int rq, void *in)
{
	switch (rq) {
	case TIRPC_GET_PARAMETERS:
		*(tirpc_pkg_params *)in = __ntirpc_pkg_params;
		break;
	case TIRPC_PUT_PARAMETERS:
		__ntirpc_pkg_params = *(tirpc_pkg_params *)in;
		break;
	case TIRPC_GET_DEBUG_FLAGS:
		*(u_int *) in = __ntirpc_pkg_params.debug_flags;
		break;
	case TIRPC_SET_DEBUG_FLAGS:
		__ntirpc_pkg_params.debug_flags = *(int *)in;
		break;
	case TIRPC_GET_OTHER_FLAGS:
		*(u_int *) in = __ntirpc_pkg_params.other_flags;
		break;
	case TIRPC_SET_OTHER_FLAGS:
		__ntirpc_pkg_params.other_flags = *(int *)in;
		break;
	default:
		return (false);
	}
	return (true);
}